

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O3

t_int * sigrsqrt_perform(t_int *w)

{
  float fVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float fVar8;
  
  pfVar6 = rsqrt_mantissatab;
  pfVar5 = rsqrt_exptab;
  tVar2 = w[3];
  if ((int)tVar2 != 0) {
    lVar3 = w[1];
    lVar4 = w[2];
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar3 + lVar7 * 4);
      fVar8 = 0.0;
      if (0.0 <= fVar1) {
        fVar8 = *(float *)((long)pfVar5 + (ulong)((uint)fVar1 >> 0x15 & 0x3fc)) *
                *(float *)((long)pfVar6 + (ulong)((uint)fVar1 >> 0xb & 0xffc));
        fVar8 = fVar8 * 1.5 + fVar8 * -0.5 * fVar8 * fVar8 * fVar1;
      }
      *(float *)(lVar4 + lVar7 * 4) = fVar8;
      lVar7 = lVar7 + 1;
    } while ((int)tVar2 != (int)lVar7);
  }
  return w + 4;
}

Assistant:

static t_int *sigrsqrt_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    while (n--)
    {
        t_sample f = *in++;
        union {
          float f;
          long l;
        } u;
        u.f = f;
        if (f < 0) *out++ = 0;
        else
        {
            t_sample g = rsqrt_exptab[(u.l >> 23) & 0xff] *
                rsqrt_mantissatab[(u.l >> 13) & 0x3ff];
            *out++ = 1.5 * g - 0.5 * g * g * g * f;
        }
    }
    return (w + 4);
}